

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

void __thiscall
kws::Parser::ReplaceCharInFixedBuffer(Parser *this,size_t pos,size_t size,char *replacingString)

{
  pointer ppVar1;
  size_t sVar2;
  value_type local_30;
  
  for (ppVar1 = (this->m_FixedPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != (this->m_FixedPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    if (ppVar1->first < pos) {
      pos = pos + ppVar1->second;
    }
  }
  std::__cxx11::string::replace((ulong)&this->m_FixedBuffer,pos,(char *)size);
  sVar2 = strlen(replacingString);
  local_30.second = sVar2 - size;
  if (local_30.second != 0) {
    local_30.first = pos;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back(&this->m_FixedPositions,&local_30);
  }
  return;
}

Assistant:

void Parser::ReplaceCharInFixedBuffer(size_t pos,size_t size,const char* replacingString)
{
  std::vector<PairType>::const_iterator it = m_FixedPositions.begin();
  while(it != m_FixedPositions.end())
    {
    if((*it).first<pos)
      {
      pos += (*it).second;
      }
    it++;
    }
  m_FixedBuffer.replace(pos,size,replacingString);

  // Keep track of the current position history
  size_t sizeNewChar = strlen(replacingString);
  if(sizeNewChar != size)
    {
    PairType p;
    p.first = pos;
    p.second = sizeNewChar-size;
    m_FixedPositions.push_back(p);
    }
}